

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setCategoryRates
          (BeagleCPUImpl<float,_1,_0> *this,double *inCategoryRates)

{
  void *pvVar1;
  void *in_RSI;
  long in_RDI;
  int categoryRatesIndex;
  
  if (**(long **)(in_RDI + 0x70) == 0) {
    pvVar1 = malloc((long)*(int *)(in_RDI + 0x34) << 3);
    **(undefined8 **)(in_RDI + 0x70) = pvVar1;
    if (**(long **)(in_RDI + 0x70) == 0) {
      return -2;
    }
  }
  memcpy((void *)**(undefined8 **)(in_RDI + 0x70),in_RSI,(long)*(int *)(in_RDI + 0x34) << 3);
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryRates(const double* inCategoryRates) {
    int categoryRatesIndex=0;
    if (gCategoryRates[categoryRatesIndex] == NULL) {
        gCategoryRates[categoryRatesIndex] = (double*) malloc(sizeof(double) * kCategoryCount);
        if (gCategoryRates[categoryRatesIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    memcpy(gCategoryRates[categoryRatesIndex], inCategoryRates, sizeof(double) * kCategoryCount);
    return BEAGLE_SUCCESS;
}